

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFragmentOpUtil.cpp
# Opt level: O0

Vector<float,_4> __thiscall
deqp::gls::FragmentOpUtil::triQuadInterpolate<tcu::Vector<float,4>>
          (FragmentOpUtil *this,Vector<float,_4> *values,float xFactor,float yFactor)

{
  undefined1 auVar2 [12];
  undefined8 uVar3;
  Vector<float,_4> VVar1;
  Vector<float,_4> local_c0;
  Vector<float,_4> local_b0;
  Vector<float,_4> local_a0;
  Vector<float,_4> local_90;
  Vector<float,_4> local_80;
  Vector<float,_4> local_70;
  Vector<float,_4> local_60;
  Vector<float,_4> local_50;
  Vector<float,_4> local_40;
  Vector<float,_4> local_30;
  float local_20;
  float local_1c;
  float yFactor_local;
  float xFactor_local;
  Vector<float,_4> *values_local;
  
  local_20 = yFactor;
  local_1c = xFactor;
  _yFactor_local = values;
  values_local = (Vector<float,_4> *)this;
  if (1.0 <= xFactor + yFactor) {
    tcu::operator-((tcu *)&local_a0,values + 1,values + 3);
    tcu::operator*((tcu *)&local_90,&local_a0,1.0 - local_1c);
    tcu::operator+((tcu *)&local_80,values + 3,&local_90);
    tcu::operator-((tcu *)&local_c0,_yFactor_local + 2,_yFactor_local + 3);
    tcu::operator*((tcu *)&local_b0,&local_c0,1.0 - local_20);
    VVar1 = tcu::operator+((tcu *)this,&local_80,&local_b0);
  }
  else {
    tcu::operator-((tcu *)&local_50,values + 2,values);
    tcu::operator*((tcu *)&local_40,&local_50,local_1c);
    tcu::operator+((tcu *)&local_30,values,&local_40);
    tcu::operator-((tcu *)&local_70,_yFactor_local + 1,_yFactor_local);
    tcu::operator*((tcu *)&local_60,&local_70,local_20);
    VVar1 = tcu::operator+((tcu *)this,&local_30,&local_60);
  }
  VVar1.m_data[0] = VVar1.m_data[0];
  auVar2._4_4_ = VVar1.m_data[1];
  register0x00001240 = VVar1.m_data[2];
  register0x00001244 = VVar1.m_data[3];
  return (Vector<float,_4>)VVar1.m_data;
}

Assistant:

inline T triQuadInterpolate (const T values[4], float xFactor, float yFactor)
{
	if (xFactor + yFactor < 1.0f)
		return values[0] + (values[2]-values[0])*xFactor		+ (values[1]-values[0])*yFactor;
	else
		return values[3] + (values[1]-values[3])*(1.0f-xFactor)	+ (values[2]-values[3])*(1.0f-yFactor);
}